

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cells_container *pcVar5;
  allocator local_151;
  string local_150 [32];
  LocationInfo local_130;
  undefined1 auStack_108 [8];
  cell reference2 [2];
  LocationInfo local_d0;
  undefined1 auStack_a8 [8];
  cell reference1 [2];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(1.2);
  iVar2 = anon_unknown_5::fp(-1.9);
  iVar3 = anon_unknown_5::fp(1.3);
  iVar4 = anon_unknown_5::fp(-0.25);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  auStack_a8._0_2_ = 1;
  auStack_a8._2_2_ = -2;
  auStack_a8._4_4_ = 0x6838;
  reference1[0].x = 0xe6;
  reference1[0].y = 1;
  reference1[0].area = 0x6a80ffff;
  reference1[0].cover = 0;
  reference1[1].x = 0xc0;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&reference2[1].area + 2),
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)((long)&reference2[1].area + 1));
  ut::LocationInfo::LocationInfo(&local_d0,(string *)((long)&reference2[1].area + 2),0x332);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])auStack_a8,pcVar5,&local_d0);
  ut::LocationInfo::~LocationInfo(&local_d0);
  std::__cxx11::string::~string((string *)((long)&reference2[1].area + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[1].area + 1));
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(0.2);
  iVar2 = anon_unknown_5::fp(1.9);
  iVar3 = anon_unknown_5::fp(0.5);
  iVar4 = anon_unknown_5::fp(2.27);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  auStack_108._0_2_ = 0;
  auStack_108._2_2_ = 1;
  auStack_108._4_4_ = 0xc7e;
  reference2[0].x = 0x1a;
  reference2[0].y = 0;
  reference2[0].area = 0x35e80002;
  reference2[0].cover = 0;
  reference2[1].x = 0x45;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_130,(string *)local_150,0x340);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])auStack_108,pcVar5,&local_130);
  ut::LocationInfo::~LocationInfo(&local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = 252)
				vr.line(fp(1.2), fp(-1.9), fp(1.3), fp(-0.25)); // in fp - [(307, -486); (333, -64)), v(26, 422)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, -2, 26680, 230 }, // dx = 14
					{ 1, -1, 27264, 192 }, // dx = 12
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (ctg = 3319)
				vr.line(fp(0.2), fp(1.9), fp(0.5), fp(2.27)); // in fp - [(51, 486); (128, 581)), v(77, 95)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 0, 1, 3198, 26 }, // dx = 21
					{ 0, 2, 13800, 69 }, // dx = 56
				};

				assert_equal(reference2, vr.cells());
			}